

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::insert_value_impl(robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    *this,size_t ibucket,distance_type dist_from_ideal_bucket,
                   truncated_hash_type hash,value_type *value)

{
  bucket_entry *pbVar1;
  unsigned_long uVar2;
  ulong uVar3;
  bucket_entry *pbVar4;
  short __tmp;
  short sVar5;
  short sVar6;
  ulong uVar7;
  
  uVar2 = value->first;
  pbVar4 = this->m_buckets + ibucket;
  value->first = *(unsigned_long *)pbVar4->m_value;
  *(unsigned_long *)pbVar4->m_value = uVar2;
  std::swap<ImputedData<long,double>>
            (&value->second,(ImputedData<long,_double> *)(pbVar4->m_value + 8));
  sVar5 = pbVar4->m_dist_from_ideal_bucket;
  pbVar4->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
  uVar7 = ibucket + 1;
  uVar3 = (this->super_power_of_two_growth_policy<2UL>).m_mask;
  pbVar4 = this->m_buckets;
  while( true ) {
    uVar7 = uVar7 & uVar3;
    sVar6 = sVar5 + 1;
    pbVar1 = pbVar4 + uVar7;
    if (pbVar4[uVar7].m_dist_from_ideal_bucket == -1) break;
    sVar5 = sVar6;
    if (pbVar4[uVar7].m_dist_from_ideal_bucket < sVar6) {
      if (0x2000 < sVar6) {
        this->m_grow_on_next_insert = true;
      }
      uVar2 = value->first;
      value->first = *(unsigned_long *)pbVar1->m_value;
      *(unsigned_long *)pbVar1->m_value = uVar2;
      std::swap<ImputedData<long,double>>
                (&value->second,(ImputedData<long,_double> *)(pbVar1->m_value + 8));
      sVar5 = pbVar1->m_dist_from_ideal_bucket;
      pbVar1->m_dist_from_ideal_bucket = sVar6;
      uVar3 = (this->super_power_of_two_growth_policy<2UL>).m_mask;
      pbVar4 = this->m_buckets;
    }
    uVar7 = uVar7 + 1;
  }
  std::pair<unsigned_long,_ImputedData<long,_double>_>::pair
            ((pair<unsigned_long,_ImputedData<long,_double>_> *)pbVar1->m_value,value);
  pbVar1->m_dist_from_ideal_bucket = sVar6;
  return;
}

Assistant:

void insert_value_impl(std::size_t ibucket,
                         distance_type dist_from_ideal_bucket,
                         truncated_hash_type hash, value_type& value) {
    tsl_rh_assert(dist_from_ideal_bucket >
                  m_buckets[ibucket].dist_from_ideal_bucket());
    m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket, hash,
                                                 value);
    ibucket = next_bucket(ibucket);
    dist_from_ideal_bucket++;

    while (!m_buckets[ibucket].empty()) {
      if (dist_from_ideal_bucket >
          m_buckets[ibucket].dist_from_ideal_bucket()) {
        if (dist_from_ideal_bucket >
            bucket_entry::DIST_FROM_IDEAL_BUCKET_LIMIT) {
          /**
           * The number of probes is really high, rehash the map on the next
           * insert. Difficult to do now as rehash may throw an exception.
           */
          m_grow_on_next_insert = true;
        }

        m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket,
                                                     hash, value);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket, hash,
                                                 std::move(value));
  }